

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetConstraints(void *kinmem,N_Vector constraints)

{
  undefined8 uVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  double dVar3;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x32f;
LAB_0010eb64:
    KINProcessError((KINMem)kinmem,error_code,line,"KINSetConstraints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,msgfmt);
  }
  else {
    if (constraints == (N_Vector)0x0) {
      if (*(int *)((long)kinmem + 0x60) != 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x140));
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) - *(long *)((long)kinmem + 0x200);
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) - *(long *)((long)kinmem + 0x208);
      }
      *(undefined4 *)((long)kinmem + 0x60) = 0;
    }
    else {
      dVar3 = (double)N_VMaxNorm(constraints);
      if (2.5 < dVar3) {
        msgfmt = "Illegal values in constraints vector.";
        iVar2 = -2;
        error_code = -2;
        line = 0x346;
        goto LAB_0010eb64;
      }
      if (*(int *)((long)kinmem + 0x60) == 0) {
        uVar1 = N_VClone(constraints);
        *(undefined8 *)((long)kinmem + 0x140) = uVar1;
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
        *(undefined4 *)((long)kinmem + 0x60) = 1;
      }
      else {
        uVar1 = *(undefined8 *)((long)kinmem + 0x140);
      }
      N_VScale(0x3ff0000000000000,constraints,uVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int KINSetConstraints(void* kinmem, N_Vector constraints)
{
  KINMem kin_mem;
  sunrealtype temptest;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (constraints == NULL)
  {
    if (kin_mem->kin_constraintsSet)
    {
      N_VDestroy(kin_mem->kin_constraints);
      kin_mem->kin_lrw -= kin_mem->kin_lrw1;
      kin_mem->kin_liw -= kin_mem->kin_liw1;
    }
    kin_mem->kin_constraintsSet = SUNFALSE;
    return (KIN_SUCCESS);
  }

  /* Check the constraints vector */

  temptest = N_VMaxNorm(constraints);
  if (temptest > TWOPT5)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_CONSTRAINTS);
    return (KIN_ILL_INPUT);
  }

  if (!kin_mem->kin_constraintsSet)
  {
    kin_mem->kin_constraints = N_VClone(constraints);
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_constraintsSet = SUNTRUE;
  }

  /* Load the constraint vector */

  N_VScale(ONE, constraints, kin_mem->kin_constraints);

  return (KIN_SUCCESS);
}